

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Entry * __thiscall
kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
          (HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo> *this,
          StringPtr key,FieldNameInfo *value)

{
  StringPtr *pSVar1;
  FieldNameInfo *pFVar2;
  Entry *pEVar3;
  Entry local_68;
  FieldNameInfo *local_28;
  FieldNameInfo *value_local;
  HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo> *this_local;
  StringPtr key_local;
  
  key_local.content.ptr = (char *)key.content.size_;
  this_local = (HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo> *)
               key.content.ptr;
  local_28 = value;
  value_local = (FieldNameInfo *)this;
  pSVar1 = mv<kj::StringPtr>((StringPtr *)&this_local);
  local_68.key.content.ptr = (pSVar1->content).ptr;
  local_68.key.content.size_ = (pSVar1->content).size_;
  pFVar2 = mv<capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>(value);
  capnp::JsonCodec::AnnotatedHandler::FieldNameInfo::FieldNameInfo(&local_68.value,pFVar2);
  pEVar3 = Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
           ::insert(&this->table,&local_68);
  Entry::~Entry(&local_68);
  return pEVar3;
}

Assistant:

typename HashMap<Key, Value>::Entry& HashMap<Key, Value>::insert(Key key, Value value) {
  return table.insert(Entry { kj::mv(key), kj::mv(value) });
}